

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O3

void detrend_ma(double *sig,int N,int window,double *oup)

{
  mafilter(sig,N,window,oup);
  return;
}

Assistant:

void detrend_ma(double *sig,int N, int window,double *oup) {
	// Uses moving average filter to detrend the signal

	mafilter(sig,N,window,oup);

	// other options are
	// 1.  mafilter2(sig,N,window,oup)
	// 2.  expfilter(sig,N,window,oup)
	// 3. mafilter_wt(sig,N,weights,window,oup) [See the code in filter.c]
	// For more information, please consult
	//Time Series: Theory and Methods Second Edition
	// by Peter J. Brockwell ,Richard A. Davis
	// Chapter 1
}